

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::
Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::
function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::
GlobalInfo&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::(anonymous_namespace)::
GlobalRefining::run(wasm::Module*)::GlobalInfo,std::less<wasm::Function*>,std::allocator<std::
pair<wasm::Function*const,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::
GlobalInfo>>>&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::
run(wasm::Module*)::GlobalInfo__>_(void *this,Module *module,Map *map,Func *work)

{
  *(undefined8 *)((long)this + 8) = 0;
  *(long *)((long)this + 0x10) = (long)this + 0x20;
  *(undefined8 *)((long)this + 0x18) = 0;
  *(undefined1 *)((long)this + 0x20) = 0;
  *(undefined1 *)((long)this + 0x50) = 0;
  *(undefined8 *)((long)this + 0x58) = 0;
  *(undefined8 *)((long)this + 0x60) = 0;
  *(undefined8 *)((long)this + 0x108) = 0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0x120) = 0;
  *(undefined8 *)((long)this + 0x128) = 0;
  *(undefined ***)this = &PTR__Mapper_01072808;
  *(Module **)((long)this + 0x130) = module;
  *(Map **)((long)this + 0x138) = map;
  std::function<void_(wasm::Function_*,_GlobalInfo_&)>::function
            ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)((long)this + 0x140),
             (function<void_(wasm::Function_*,_GlobalInfo_&)> *)work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}